

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::String::EndsWith(String *this,char *suffix)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  bVar1 = true;
  if ((suffix != (char *)0x0) && (*suffix != '\0')) {
    __s = this->c_str_;
    if (__s != (char *)0x0) {
      sVar3 = strlen(__s);
      sVar4 = strlen(suffix);
      if (sVar4 <= sVar3) {
        iVar2 = strcmp(__s + (sVar3 - sVar4),suffix);
        return iVar2 == 0;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool String::EndsWith(const char* suffix) const {
  if (suffix == NULL || CStringEquals(suffix, "")) return true;

  if (c_str() == NULL) return false;

  const size_t this_len = strlen(c_str());
  const size_t suffix_len = strlen(suffix);
  return (this_len >= suffix_len) &&
         CStringEquals(c_str() + this_len - suffix_len, suffix);
}